

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderBitfieldOperationTests.cpp
# Opt level: O1

void __thiscall
glcts::ShaderBitfieldOperationCaseBitfieldInsertUint::ShaderBitfieldOperationCaseBitfieldInsertUint
          (ShaderBitfieldOperationCaseBitfieldInsertUint *this,Context *context,char *name,
          GLSLVersion glslVersion,Data *data,Data *insert,int offset,int bits,int components,
          char *testStatement)

{
  int iVar1;
  ulong uVar2;
  
  ShaderBitfieldOperationCase::ShaderBitfieldOperationCase
            (&this->super_ShaderBitfieldOperationCase,context,name,fixed_sample_locations_values + 1
             ,glslVersion,data,testStatement);
  (this->super_ShaderBitfieldOperationCase).super_TestCase.super_TestCase.super_TestNode.
  _vptr_TestNode = (_func_int **)&PTR__ShaderBitfieldOperationCase_02139fb0;
  this->m_components = components;
  if (0 < components) {
    uVar2 = 0;
    do {
      (this->super_ShaderBitfieldOperationCase).m_data.in2Uvec4[uVar2] = insert->inUvec4[uVar2];
      uVar2 = uVar2 + 1;
    } while ((uint)components != uVar2);
  }
  iVar1 = bits + -0x20 + offset;
  if (bits + offset < 0x21) {
    iVar1 = 0;
  }
  (this->super_ShaderBitfieldOperationCase).m_data.offset = offset - iVar1;
  (this->super_ShaderBitfieldOperationCase).m_data.bits = bits;
  return;
}

Assistant:

ShaderBitfieldOperationCaseBitfieldInsertUint(Context& context, const char* name, glu::GLSLVersion glslVersion,
												  Data const& data, Data const& insert, int offset, int bits,
												  int components, char const* testStatement)
		: ShaderBitfieldOperationCase(context, name, "", glslVersion, data, testStatement), m_components(components)
	{
		for (int i = 0; i < components; ++i)
		{
			m_data.in2Uvec4[i] = insert.inUvec4[i];
		}
		if (offset + bits > 32)
		{
			offset -= (offset + bits) - 32;
		}
		m_data.offset = offset;
		m_data.bits   = bits;
	}